

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# focuser_state.cpp
# Opt level: O0

void __thiscall FS::Focuser::setMotor(Focuser *this,WifiDebugOstream *log,MotorState m)

{
  pointer pHVar1;
  WifiDebugOstream *pWVar2;
  undefined8 uVar3;
  char *string;
  MotorState m_local;
  WifiDebugOstream *log_local;
  Focuser *this_local;
  
  this->motorState = m;
  pHVar1 = std::unique_ptr<HWI,_std::default_delete<HWI>_>::operator->(&this->hardware);
  uVar3 = 5;
  if (m == ON) {
    uVar3 = 4;
  }
  (*pHVar1->_vptr_HWI[2])(pHVar1,2,uVar3);
  pWVar2 = ::operator<<(log,"Motor set ");
  string = "off";
  if (m == ON) {
    string = "on";
  }
  pWVar2 = ::operator<<(pWVar2,string);
  ::operator<<(pWVar2,"\n");
  return;
}

Assistant:

void Focuser::setMotor( WifiDebugOstream& log, MotorState m )
{
  motorState = m;

  hardware->DigitalWrite( HWI::Pin::MOTOR_ENA, ( m == MotorState::ON ) ?
      HWI::PinState::MOTOR_ON :
      HWI::PinState::MOTOR_OFF );

  log << "Motor set " << (( m == MotorState::ON ) ? "on" : "off" ) << "\n";
}